

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateSpaceFilter.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
rtb::Filter::StateSpaceFilter<double>::pass
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          StateSpaceFilter<double> *this,vector<double,_std::allocator<double>_> *values,double f0)

{
  double *pdVar1;
  iterator __position;
  double *pdVar2;
  double time;
  double local_30;
  
  this->lastTime_ = INFINITY;
  this->lastValue_ = 0.0;
  this->lastFirstDerivative_ = 0.0;
  this->lastSecondDerivative_ = 0.0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pdVar2 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar1) {
    time = 0.0;
    do {
      local_30 = filter(this,*pdVar2,time,f0);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,__position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      time = time + 0.001;
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 != pdVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> StateSpaceFilter<T>::pass(const std::vector<T>& values, double f0) {

            resetState();
            std::vector<T> filteredValues;
            double time(0.), timeDelta(0.001);
            for (auto val : values) {
                filteredValues.push_back(filter(val, time, f0));
                time += timeDelta;
            }
            return filteredValues;
        }